

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS
ref_layer_align_quad_advance
          (REF_GRID ref_grid,REF_CLOUD last,REF_LIST last_list,REF_CLOUD next,REF_LIST next_list)

{
  int iVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint unaff_R15D;
  bool bVar6;
  double dVar7;
  REF_INT node;
  REF_INT new_node;
  REF_INT id;
  REF_CAVITY ref_cavity;
  REF_DBL xyz [3];
  REF_DBL normal [3];
  REF_INT closest_node;
  REF_DBL uv [2];
  REF_DBL dist;
  REF_DBL d [12];
  REF_DBL m [6];
  REF_INT local_174;
  int local_170;
  REF_INT local_16c;
  REF_CAVITY local_168;
  REF_GEOM local_160;
  REF_GRID local_158;
  REF_GLOB local_150;
  REF_DBL local_148;
  REF_DBL local_140;
  REF_DBL local_138;
  double local_128 [4];
  REF_LIST local_108;
  REF_CLOUD local_100;
  REF_LIST local_f8;
  REF_INT local_ec;
  REF_DBL local_e8 [3];
  REF_DBL local_d0;
  double local_c8 [3];
  double local_b0;
  double local_a8;
  double local_a0;
  REF_DBL local_68 [7];
  
  if (last->n < 1) {
    local_150 = -1;
  }
  else {
    local_150 = *last->global;
  }
  ref_node = ref_grid->node;
  local_160 = ref_grid->geom;
  if (0 < last->n) {
    lVar5 = 0;
    local_158 = ref_grid;
    local_108 = next_list;
    local_100 = next;
    local_f8 = last_list;
    do {
      uVar3 = ref_node_local(ref_node,local_150,&local_174);
      if (uVar3 == 0) {
        iVar1 = last->naux;
        if (0 < (long)iVar1) {
          pRVar2 = last->aux;
          lVar4 = 0;
          do {
            local_128[lVar4] = pRVar2[iVar1 * (int)lVar5 + lVar4];
            lVar4 = lVar4 + 1;
          } while (iVar1 != lVar4);
        }
        uVar3 = ref_node_metric_get(ref_node,local_174,local_68);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x270,"ref_layer_align_quad_advance",(ulong)uVar3,"get");
          goto LAB_002258f1;
        }
        uVar3 = ref_matrix_diag_m(local_68,local_c8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x271,"ref_layer_align_quad_advance",(ulong)uVar3,"eigen decomp");
          goto LAB_002258f1;
        }
        uVar3 = ref_matrix_descending_eig_twod(local_c8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x272,"ref_layer_align_quad_advance",(ulong)uVar3,"2D eig sort");
          goto LAB_002258f1;
        }
        dVar7 = local_128[2] * local_a0 + local_128[0] * local_b0 + local_128[1] * local_a8;
        if (dVar7 <= -dVar7) {
          dVar7 = -dVar7;
        }
        bVar6 = true;
        if (0.9848 < dVar7) {
          if (local_c8[0] < 0.0) {
            dVar7 = sqrt(local_c8[0]);
          }
          else {
            dVar7 = SQRT(local_c8[0]);
          }
          dVar7 = 1.0 / dVar7;
          pRVar2 = ref_node->real;
          lVar4 = (long)local_174;
          local_148 = local_128[0] * dVar7 + pRVar2[lVar4 * 0xf];
          local_140 = local_128[1] * dVar7 + pRVar2[lVar4 * 0xf + 1];
          local_138 = dVar7 * local_128[2] + pRVar2[lVar4 * 0xf + 2];
          uVar3 = ref_node_nearest_xyz(ref_node,&local_148,&local_ec,&local_d0);
          if (uVar3 == 0) {
            uVar3 = ref_node_next_global(ref_node,&local_150);
            if (uVar3 == 0) {
              uVar3 = ref_cloud_store(local_100,local_150,local_128);
              if (uVar3 == 0) {
                uVar3 = ref_list_push(local_108,local_174);
                if (uVar3 == 0) {
                  uVar3 = ref_node_add(ref_node,local_150,&local_170);
                  if (uVar3 == 0) {
                    pRVar2 = ref_node->real;
                    lVar4 = (long)local_170;
                    pRVar2[lVar4 * 0xf] = local_148;
                    pRVar2[lVar4 * 0xf + 1] = local_140;
                    pRVar2[lVar4 * 0xf + 2] = local_138;
                    uVar3 = ref_geom_unique_id(local_160,local_174,2,&local_16c);
                    if (uVar3 == 0) {
                      uVar3 = ref_geom_tuv(local_160,local_174,2,local_16c,local_e8);
                      if (uVar3 == 0) {
                        uVar3 = ref_egads_inverse_eval(local_160,2,local_16c,&local_148,local_e8);
                        if (uVar3 == 0) {
                          uVar3 = ref_geom_add(local_160,local_170,2,local_16c,local_e8);
                          if (uVar3 == 0) {
                            uVar3 = ref_metric_interpolate_between(local_158,local_174,-1,local_170)
                            ;
                            if (uVar3 == 0) {
                              uVar3 = ref_cavity_create(&local_168);
                              if (uVar3 == 0) {
                                uVar3 = ref_cavity_form_insert
                                                  (local_168,local_158,local_170,local_174,
                                                   local_f8->value[lVar5],-1);
                                if (uVar3 == 0) {
                                  uVar3 = ref_cavity_enlarge_conforming(local_168);
                                  if (uVar3 == 0) {
                                    if (local_168->state == REF_CAVITY_VISIBLE) {
                                      uVar3 = ref_cavity_replace(local_168);
                                      if (uVar3 == 0) {
LAB_00225fd6:
                                        uVar3 = ref_cavity_free(local_168);
                                        bVar6 = uVar3 == 0;
                                        if (!bVar6) {
                                          bVar6 = false;
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                                 ,0x2a4,"ref_layer_align_quad_advance",(ulong)uVar3,
                                                 "cav free");
                                          unaff_R15D = uVar3;
                                        }
                                        goto LAB_002258f3;
                                      }
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                             ,0x29d,"ref_layer_align_quad_advance",(ulong)uVar3,
                                             "cav replace");
                                      ref_cavity_tec(local_168,"ref_layer_align_quad_cavity.tec");
                                      ref_export_by_extension
                                                (local_158,"ref_layer_align_quad_mesh.tec");
                                      printf("norm %f %f %f dir %f %f %f dot %f\n");
                                      printf("new %f %f %f\n",local_148,local_140,local_138);
                                    }
                                    else {
                                      uVar3 = ref_node_remove(ref_node,local_170);
                                      if (uVar3 == 0) {
                                        uVar3 = ref_geom_remove_all(local_160,local_170);
                                        if (uVar3 == 0) {
                                          local_100->n = local_100->n + -1;
                                          local_108->n = local_108->n + -1;
                                          goto LAB_00225fd6;
                                        }
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                               ,0x2a0,"ref_layer_align_quad_advance",(ulong)uVar3,
                                               "rm");
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                               ,0x29f,"ref_layer_align_quad_advance",(ulong)uVar3,
                                               "rm");
                                      }
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                           ,0x295,"ref_layer_align_quad_advance",(ulong)uVar3,
                                           "enlarge");
                                    ref_cavity_tec(local_168,"cav-fail.tec");
                                    ref_export_by_extension(local_158,"mesh-fail.tec");
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x291,"ref_layer_align_quad_advance",(ulong)uVar3,"ball");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                       ,0x28e,"ref_layer_align_quad_advance",(ulong)uVar3,
                                       "cav create");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x28d,"ref_layer_align_quad_advance",(ulong)uVar3,
                                     "metric interp");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x28b,"ref_layer_align_quad_advance",(ulong)uVar3,"new geom");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x28a,"ref_layer_align_quad_advance",(ulong)uVar3,"inverse uv");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x289,"ref_layer_align_quad_advance",(ulong)uVar3,"uv");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x288,"ref_layer_align_quad_advance",(ulong)uVar3,"unique face id");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x283,"ref_layer_align_quad_advance",(ulong)uVar3,"add");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x282,"ref_layer_align_quad_advance",(ulong)uVar3,"store list");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x281,"ref_layer_align_quad_advance",(ulong)uVar3,"store cloud");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x280,"ref_layer_align_quad_advance",(ulong)uVar3,"global");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x27f,"ref_layer_align_quad_advance",(ulong)uVar3,"close");
          }
          goto LAB_002258f1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x26c,"ref_layer_align_quad_advance",(ulong)uVar3,"local");
LAB_002258f1:
        bVar6 = false;
        unaff_R15D = uVar3;
      }
LAB_002258f3:
      if (!bVar6) {
        return unaff_R15D;
      }
      lVar5 = lVar5 + 1;
      local_150 = -1;
      if (lVar5 < last->n) {
        local_150 = last->global[lVar5];
      }
    } while (lVar5 < last->n);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_layer_align_quad_advance(REF_GRID ref_grid,
                                                       REF_CLOUD last,
                                                       REF_LIST last_list,
                                                       REF_CLOUD next,
                                                       REF_LIST next_list) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT node, item;
  REF_GLOB global;

  each_ref_cloud_global(last, item, global) {
    REF_DBL normal[3];

    REF_DBL d[12], m[6];
    REF_DBL dot;
    REF_INT aux_index;
    RSS(ref_node_local(ref_node, global, &node), "local");
    each_ref_cloud_aux(last, aux_index) {
      normal[aux_index] = ref_cloud_aux(last, aux_index, item);
    }
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    RSS(ref_matrix_diag_m(m, d), "eigen decomp");
    RSS(ref_matrix_descending_eig_twod(d), "2D eig sort");
    dot = ref_math_dot(normal, &(d[3]));
    if (ABS(dot) > 0.9848) { /* cos(10 degrees) */
      REF_DBL h, xyz[3], dist;
      REF_INT closest_node;
      REF_INT new_node;
      REF_INT type, id;
      REF_DBL uv[2];
      REF_CAVITY ref_cavity;
      h = 1.0 / sqrt(d[0]);
      xyz[0] = ref_node_xyz(ref_node, 0, node) + h * normal[0];
      xyz[1] = ref_node_xyz(ref_node, 1, node) + h * normal[1];
      xyz[2] = ref_node_xyz(ref_node, 2, node) + h * normal[2];
      RSS(ref_node_nearest_xyz(ref_node, xyz, &closest_node, &dist), "close");
      RSS(ref_node_next_global(ref_node, &global), "global");
      RSS(ref_cloud_store(next, global, normal), "store cloud");
      RSS(ref_list_push(next_list, node), "store list");
      RSS(ref_node_add(ref_node, global, &new_node), "add");
      ref_node_xyz(ref_node, 0, new_node) = xyz[0];
      ref_node_xyz(ref_node, 1, new_node) = xyz[1];
      ref_node_xyz(ref_node, 2, new_node) = xyz[2];
      type = REF_GEOM_FACE;
      RSS(ref_geom_unique_id(ref_geom, node, type, &id), "unique face id");
      RSS(ref_geom_tuv(ref_geom, node, type, id, uv), "uv");
      RSS(ref_egads_inverse_eval(ref_geom, type, id, xyz, uv), "inverse uv");
      RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");
      RSS(ref_metric_interpolate_between(ref_grid, node, REF_EMPTY, new_node),
          "metric interp");
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      RSS(ref_cavity_form_insert(ref_cavity, ref_grid, new_node, node,
                                 ref_list_value(last_list, item), REF_EMPTY),
          "ball");
      RSB(ref_cavity_enlarge_conforming(ref_cavity), "enlarge", {
        ref_cavity_tec(ref_cavity, "cav-fail.tec");
        ref_export_by_extension(ref_grid, "mesh-fail.tec");
      });
      if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
        RSB(ref_cavity_replace(ref_cavity), "cav replace", {
          ref_cavity_tec(ref_cavity, "ref_layer_align_quad_cavity.tec");
          ref_export_by_extension(ref_grid, "ref_layer_align_quad_mesh.tec");
          printf("norm %f %f %f dir %f %f %f dot %f\n", normal[0], normal[1],
                 normal[2], d[3], d[4], d[5], ref_math_dot(normal, &(d[3])));
          printf("new %f %f %f\n", xyz[0], xyz[1], xyz[2]);
        });
      } else {
        RSS(ref_node_remove(ref_node, new_node), "rm");
        RSS(ref_geom_remove_all(ref_geom, new_node), "rm");
        ref_cloud_n(next)--;
        ref_list_n(next_list)--;
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
    }
  }

  return REF_SUCCESS;
}